

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O0

void __thiscall soplex::CLUFactorRational::remaxRow(CLUFactorRational *this,int p_row,int len)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  int in_EDX;
  long lVar4;
  int in_ESI;
  long in_RDI;
  int *idx;
  Dring *ring;
  VectorRational *val;
  int k;
  int j;
  int i;
  int delta;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  CLUFactorRational *in_stack_ffffffffffffffa0;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  CLUFactorRational *in_stack_fffffffffffffff0;
  
  if (*(long *)(*(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18) == in_RDI + 0x160) {
    local_24 = in_EDX - *(int *)(*(long *)(in_RDI + 0x1b8) + (long)in_ESI * 4);
    iVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x217b25);
    if (iVar3 - *(int *)(in_RDI + 0x180) < local_24) {
      packRows(in_stack_fffffffffffffff0);
      local_24 = in_EDX - *(int *)(*(long *)(in_RDI + 0x1b8) + (long)in_ESI * 4);
      iVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)0x217b70);
      if ((double)iVar3 <
          *(double *)(in_RDI + 0x90) * (double)*(int *)(in_RDI + 0x180) + (double)in_EDX) {
        minRowMem(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      }
    }
    *(int *)(in_RDI + 0x180) = local_24 + *(int *)(in_RDI + 0x180);
    *(int *)(*(long *)(in_RDI + 0x1b8) + (long)in_ESI * 4) = in_EDX;
  }
  else {
    iVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x217c13);
    if (iVar3 - *(int *)(in_RDI + 0x180) < in_EDX) {
      packRows(in_stack_fffffffffffffff0);
      iVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)0x217c47);
      if ((double)iVar3 <
          *(double *)(in_RDI + 0x90) * (double)*(int *)(in_RDI + 0x180) + (double)in_EDX) {
        minRowMem(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      }
    }
    lVar1 = *(long *)(in_RDI + 0x1a0);
    local_2c = *(int *)(in_RDI + 0x180);
    local_28 = *(int *)(*(long *)(in_RDI + 0x1a8) + (long)in_ESI * 4);
    iVar3 = *(int *)(*(long *)(in_RDI + 0x1b0) + (long)in_ESI * 4) + local_28;
    *(int *)(*(long *)(in_RDI + 0x1a8) + (long)in_ESI * 4) = local_2c;
    *(int *)(in_RDI + 0x180) = in_EDX + *(int *)(in_RDI + 0x180);
    lVar4 = (long)*(int *)(*(long *)(*(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18 + 8) + 0x10);
    *(int *)(*(long *)(in_RDI + 0x1b8) + lVar4 * 4) =
         *(int *)(*(long *)(in_RDI + 0x1b8) + (long)in_ESI * 4) +
         *(int *)(*(long *)(in_RDI + 0x1b8) + lVar4 * 4);
    *(int *)(*(long *)(in_RDI + 0x1b8) + (long)in_ESI * 4) = in_EDX;
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18) + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18 + 8);
    **(undefined8 **)(*(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18 + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18);
    plVar2 = *(long **)(in_RDI + 0x168);
    *(long *)(*(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18) = *plVar2;
    *(long *)(*(long *)(*(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18) + 8) =
         *(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18;
    *(long **)(*(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18 + 8) = plVar2;
    *plVar2 = *(long *)(in_RDI + 0x178) + (long)in_ESI * 0x18;
    for (; local_28 < iVar3; local_28 = local_28 + 1) {
      in_stack_ffffffffffffffa0 =
           (CLUFactorRational *)
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)in_stack_ffffffffffffffa0,
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      *(undefined4 *)(lVar1 + (long)local_2c * 4) = *(undefined4 *)(lVar1 + (long)local_28 * 4);
      local_2c = local_2c + 1;
    }
  }
  return;
}

Assistant:

inline void CLUFactorRational::remaxRow(int p_row, int len)
{
   assert(u.row.max[p_row] < len);

   if(u.row.elem[p_row].next == &(u.row.list))      /* last in row file */
   {
      int delta = len - u.row.max[p_row];

      if(delta > u.row.val.dim() - u.row.used)
      {
         packRows();
         delta = len - u.row.max[p_row];  // packRows() changes u.row.max[] !

         if(u.row.val.dim() < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len); */
      }

      assert(delta <= u.row.val.dim() - u.row.used

             && "ERROR: could not allocate memory for row file");

      u.row.used += delta;
      u.row.max[p_row] = len;
   }
   else                        /* row must be moved to end of row file */
   {
      int i, j, k;
      VectorRational& val = u.row.val;
      Dring* ring;

      if(len > u.row.val.dim() - u.row.used)
      {
         packRows();

         if(u.row.val.dim() < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len);*/
      }

      assert(len <= u.row.val.dim() - u.row.used

             && "ERROR: could not allocate memory for row file");

      int* idx = u.row.idx;
      j = u.row.used;
      i = u.row.start[p_row];
      k = u.row.len[p_row] + i;
      u.row.start[p_row] = j;
      u.row.used += len;

      u.row.max[u.row.elem[p_row].prev->idx] += u.row.max[p_row];
      u.row.max[p_row] = len;
      removeDR(u.row.elem[p_row]);
      ring = u.row.list.prev;
      init2DR(u.row.elem[p_row], *ring);

      for(; i < k; ++i, ++j)
      {
         val[j] = val[i];
         idx[j] = idx[i];
      }
   }

   assert(u.row.start[u.row.list.prev->idx] + u.row.max[u.row.list.prev->idx]

          == u.row.used);
}